

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O3

int c(void *param_1,void *param_2)

{
  uint uVar1;
  long in_RCX;
  int R;
  int in_EDX;
  int iVar2;
  uint uVar3;
  long in_R8;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  if (-1 < in_EDX) {
    uVar5 = 0;
    iVar9 = in_EDX;
    do {
      uVar4 = uVar5 + iVar9 >> 1;
      uVar8 = *(uint *)(in_RCX + (ulong)uVar4 * 4);
      uVar3 = (uint)param_2;
      if (uVar8 < uVar3) {
        uVar5 = uVar4 + 1;
      }
      else {
        if (uVar8 <= uVar3) break;
        iVar9 = uVar4 - 1;
      }
      uVar4 = uVar5;
    } while ((int)uVar5 <= iVar9);
    uVar5 = uVar3 - (int)param_1;
    uVar8 = 0;
    iVar9 = in_EDX;
    do {
      uVar7 = uVar8 + iVar9 >> 1;
      uVar6 = *(uint *)(in_R8 + (ulong)uVar7 * 4);
      if (uVar6 < uVar5) {
        uVar8 = uVar7 + 1;
      }
      else {
        if (uVar6 <= uVar5) {
          uVar8 = uVar7 + 1;
          break;
        }
        iVar9 = uVar7 - 1;
      }
    } while ((int)uVar8 <= iVar9);
    if (((int)uVar8 <= in_EDX) && (uVar4 - uVar8 != 0)) {
      uVar6 = *(uint *)(in_R8 + -4 + (long)(int)uVar4 * 4);
      if (uVar3 <= uVar6) {
        uVar6 = uVar3;
      }
      uVar7 = *(uint *)(in_RCX + -4 + (long)(int)uVar4 * 4);
      if (uVar7 <= uVar5) {
        uVar7 = uVar5;
      }
      uVar1 = *(uint *)(in_R8 + (ulong)uVar8 * 4);
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      uVar1 = *(uint *)(in_RCX + (ulong)uVar8 * 4);
      if (uVar5 < uVar1) {
        uVar5 = uVar1;
      }
      iVar2 = ((uVar4 - uVar8) - (uint)(uVar6 < uVar7 + 1)) - (uint)(uVar3 < uVar5 + 1);
      iVar9 = 0;
      if (0 < iVar2) {
        iVar9 = iVar2;
      }
      return iVar9;
    }
  }
  return 0;
}

Assistant:

int first_geq(unsigned int* I_start, int m, int h)
{
    int L = 0, R = m;
    int i;
    while(L<=R)
    {
        i = (L+R) / 2;
        if(I_start[i]<h)
            L = i + 1;
        else if(I_start[i]>h)
            R = i - 1;
        else
            return i;
    }
    return L;  
}